

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

bool __thiscall
ImplicitDepLoader::LoadDepFile(ImplicitDepLoader *this,Edge *edge,string *path,string *err)

{
  char *pcVar1;
  State *this_00;
  Metrics *this_01;
  FILE *pFVar2;
  bool bVar3;
  int iVar4;
  Metric *pMVar5;
  ulong uVar6;
  pointer pSVar7;
  reference ppNVar8;
  string *psVar9;
  reference pSVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  size_type sVar14;
  Node *this_02;
  reference ppNVar15;
  Metric *local_370;
  Node *node;
  uint64_t slash_bits;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
  local_320;
  iterator i;
  iterator implicit_dep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_290;
  iterator local_288;
  Node **local_280;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_278;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_270;
  StringPiece *local_268;
  matches local_260;
  matches m;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
  local_250;
  iterator o;
  undefined1 local_228 [8];
  StringPiece opath;
  Node *first_output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
  local_1d0;
  iterator primary_out;
  uint64_t unused;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string depfile_err;
  undefined1 local_138 [8];
  DepfileParser depfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string content;
  ScopedMetric metrics_h_scoped;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *err_local;
  string *path_local;
  Edge *edge_local;
  ImplicitDepLoader *this_local;
  
  local_30 = err;
  err_local = path;
  path_local = (string *)edge;
  edge_local = (Edge *)this;
  if ((LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric ==
       '\0') &&
     (iVar4 = __cxa_guard_acquire(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)
                                   ::metrics_h_metric), this_01 = g_metrics, iVar4 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      local_370 = (Metric *)0x0;
      LoadDepFile::metrics_h_metric = local_370;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"depfile load",&local_51);
      pMVar5 = Metrics::NewMetric(this_01,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      LoadDepFile::metrics_h_metric = pMVar5;
    }
    __cxa_guard_release(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric
            ((ScopedMetric *)((long)&content.field_2 + 8),LoadDepFile::metrics_h_metric);
  std::__cxx11::string::string((string *)local_98);
  iVar4 = (**(code **)(*(long *)this->disk_interface_ + 0x10))
                    (this->disk_interface_,err_local,(string *)local_98,local_30);
  if (iVar4 != 0) {
    if (iVar4 == 1) {
      std::__cxx11::string::clear();
    }
    else if (iVar4 == 2) {
      std::operator+(&local_f8,"loading \'",err_local);
      std::operator+(&local_d8,&local_f8,"\': ");
      std::operator+(&local_b8,&local_d8,local_30);
      std::__cxx11::string::operator=((string *)local_30,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      this_local._7_1_ = 0;
      depfile._52_4_ = 1;
      goto LAB_001338d5;
    }
  }
  uVar6 = std::__cxx11::string::empty();
  pFVar2 = _stderr;
  if ((uVar6 & 1) == 0) {
    if (this->depfile_parser_options_ == (DepfileParserOptions *)0x0) {
      DepfileParserOptions::DepfileParserOptions
                ((DepfileParserOptions *)(depfile_err.field_2._M_local_buf + 0xf));
    }
    DepfileParser::DepfileParser((DepfileParser *)local_138);
    std::__cxx11::string::string((string *)local_160);
    bVar3 = DepfileParser::Parse((DepfileParser *)local_138,(string *)local_98,(string *)local_160);
    if (bVar3) {
      bVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::empty
                        ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_138);
      if (bVar3) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&unused,
                       err_local,": no outputs declared");
        std::__cxx11::string::operator=((string *)local_30,(string *)&unused);
        std::__cxx11::string::~string((string *)&unused);
        this_local._7_1_ = 0;
      }
      else {
        local_1d0._M_current =
             (StringPiece *)
             std::vector<StringPiece,_std::allocator<StringPiece>_>::begin
                       ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_138);
        pSVar7 = __gnu_cxx::
                 __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                 ::operator->(&local_1d0);
        pcVar1 = pSVar7->str_;
        pSVar7 = __gnu_cxx::
                 __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                 ::operator->(&local_1d0);
        bVar3 = CanonicalizePath(pcVar1,&pSVar7->len_,(uint64_t *)&primary_out,local_30);
        if (bVar3) {
          ppNVar8 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               &path_local[1]._M_string_length,0);
          opath.len_ = (size_t)*ppNVar8;
          psVar9 = Node::path_abi_cxx11_((Node *)opath.len_);
          StringPiece::StringPiece((StringPiece *)local_228,psVar9);
          pSVar10 = __gnu_cxx::
                    __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                    ::operator*(&local_1d0);
          bVar3 = StringPiece::operator!=((StringPiece *)local_228,pSVar10);
          pFVar2 = _stderr;
          if (bVar3) {
            if ((g_explaining & 1U) != 0) {
              uVar11 = std::__cxx11::string::c_str();
              Node::path_abi_cxx11_((Node *)opath.len_);
              uVar12 = std::__cxx11::string::c_str();
              pSVar7 = __gnu_cxx::
                       __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                       ::operator->(&local_1d0);
              StringPiece::AsString_abi_cxx11_((string *)&o,pSVar7);
              uVar13 = std::__cxx11::string::c_str();
              fprintf(pFVar2,
                      "ninja explain: expected depfile \'%s\' to mention \'%s\', got \'%s\'\n",
                      uVar11,uVar12,uVar13);
              std::__cxx11::string::~string((string *)&o);
            }
            this_local._7_1_ = 0;
          }
          else {
            local_250._M_current =
                 (StringPiece *)
                 std::vector<StringPiece,_std::allocator<StringPiece>_>::begin
                           ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_138);
            while( true ) {
              m.i_ = std::vector<StringPiece,_std::allocator<StringPiece>_>::end
                               ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_138);
              bVar3 = __gnu_cxx::operator!=(&local_250,&m.i_);
              psVar9 = path_local;
              if (!bVar3) break;
              local_268 = local_250._M_current;
              matches::matches(&local_260,(iterator)local_250._M_current);
              local_278._M_current =
                   (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                                      ((vector<Node_*,_std::allocator<Node_*>_> *)
                                       &path_local[1]._M_string_length);
              local_280 = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                             ((vector<Node_*,_std::allocator<Node_*>_> *)
                                              &path_local[1]._M_string_length);
              local_288 = local_260.i_._M_current;
              local_270 = std::
                          find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,matches>
                                    (local_278,
                                     (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                      )local_280,local_260);
              local_290._M_current =
                   (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                      ((vector<Node_*,_std::allocator<Node_*>_> *)
                                       &path_local[1]._M_string_length);
              bVar3 = __gnu_cxx::operator==(&local_270,&local_290);
              if (bVar3) {
                std::operator+(&local_2f0,err_local,": depfile mentions \'");
                pSVar7 = __gnu_cxx::
                         __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                         ::operator->(&local_250);
                StringPiece::AsString_abi_cxx11_((string *)&implicit_dep,pSVar7);
                std::operator+(&local_2d0,&local_2f0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &implicit_dep);
                std::operator+(&local_2b0,&local_2d0,
                               "\' as an output, but no such output was declared");
                std::__cxx11::string::operator=((string *)local_30,(string *)&local_2b0);
                std::__cxx11::string::~string((string *)&local_2b0);
                std::__cxx11::string::~string((string *)&local_2d0);
                std::__cxx11::string::~string((string *)&implicit_dep);
                std::__cxx11::string::~string((string *)&local_2f0);
                this_local._7_1_ = 0;
                goto LAB_001338a1;
              }
              __gnu_cxx::
              __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
              ::operator++(&local_250);
            }
            sVar14 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                               ((vector<StringPiece,_std::allocator<StringPiece>_> *)
                                &depfile.outs_.
                                 super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            i._M_current = (StringPiece *)PreallocateSpace(this,(Edge *)psVar9,(int)sVar14);
            local_320._M_current =
                 (StringPiece *)
                 std::vector<StringPiece,_std::allocator<StringPiece>_>::begin
                           ((vector<StringPiece,_std::allocator<StringPiece>_> *)
                            &depfile.outs_.
                             super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
            while( true ) {
              slash_bits = (uint64_t)
                           std::vector<StringPiece,_std::allocator<StringPiece>_>::end
                                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)
                                      &depfile.outs_.
                                       super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
              bVar3 = __gnu_cxx::operator!=
                                (&local_320,
                                 (__normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                                  *)&slash_bits);
              if (!bVar3) break;
              pSVar7 = __gnu_cxx::
                       __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                       ::operator->(&local_320);
              pcVar1 = pSVar7->str_;
              pSVar7 = __gnu_cxx::
                       __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                       ::operator->(&local_320);
              bVar3 = CanonicalizePath(pcVar1,&pSVar7->len_,(uint64_t *)&node,local_30);
              if (!bVar3) {
                this_local._7_1_ = 0;
                goto LAB_001338a1;
              }
              this_00 = this->state_;
              pSVar10 = __gnu_cxx::
                        __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                        ::operator*(&local_320);
              this_02 = State::GetNode(this_00,*pSVar10,(uint64_t)node);
              ppNVar15 = __gnu_cxx::
                         __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                         operator*((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                    *)&i);
              *ppNVar15 = this_02;
              Node::AddOutEdge(this_02,(Edge *)path_local);
              CreatePhonyInEdge(this,this_02);
              __gnu_cxx::
              __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
              ::operator++(&local_320);
              __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator++((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                          *)&i);
            }
            this_local._7_1_ = 1;
          }
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &first_output,err_local,": ");
          std::operator+(&local_1f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &first_output,local_30);
          std::__cxx11::string::operator=((string *)local_30,(string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&first_output);
          this_local._7_1_ = 0;
        }
      }
    }
    else {
      std::operator+(&local_1a0,err_local,": ");
      std::operator+(&local_180,&local_1a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160)
      ;
      std::__cxx11::string::operator=((string *)local_30,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      this_local._7_1_ = 0;
    }
LAB_001338a1:
    depfile._52_4_ = 1;
    std::__cxx11::string::~string((string *)local_160);
    DepfileParser::~DepfileParser((DepfileParser *)local_138);
  }
  else {
    if ((g_explaining & 1U) != 0) {
      uVar11 = std::__cxx11::string::c_str();
      fprintf(pFVar2,"ninja explain: depfile \'%s\' is missing\n",uVar11);
    }
    this_local._7_1_ = 0;
    depfile._52_4_ = 1;
  }
LAB_001338d5:
  std::__cxx11::string::~string((string *)local_98);
  ScopedMetric::~ScopedMetric((ScopedMetric *)((long)&content.field_2 + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ImplicitDepLoader::LoadDepFile(Edge* edge, const string& path,
                                    string* err) {
  METRIC_RECORD("depfile load");
  // Read depfile content.  Treat a missing depfile as empty.
  string content;
  switch (disk_interface_->ReadFile(path, &content, err)) {
  case DiskInterface::Okay:
    break;
  case DiskInterface::NotFound:
    err->clear();
    break;
  case DiskInterface::OtherError:
    *err = "loading '" + path + "': " + *err;
    return false;
  }
  // On a missing depfile: return false and empty *err.
  if (content.empty()) {
    EXPLAIN("depfile '%s' is missing", path.c_str());
    return false;
  }

  DepfileParser depfile(depfile_parser_options_
                        ? *depfile_parser_options_
                        : DepfileParserOptions());
  string depfile_err;
  if (!depfile.Parse(&content, &depfile_err)) {
    *err = path + ": " + depfile_err;
    return false;
  }

  if (depfile.outs_.empty()) {
    *err = path + ": no outputs declared";
    return false;
  }

  uint64_t unused;
  std::vector<StringPiece>::iterator primary_out = depfile.outs_.begin();
  if (!CanonicalizePath(const_cast<char*>(primary_out->str_),
                        &primary_out->len_, &unused, err)) {
    *err = path + ": " + *err;
    return false;
  }

  // Check that this depfile matches the edge's output, if not return false to
  // mark the edge as dirty.
  Node* first_output = edge->outputs_[0];
  StringPiece opath = StringPiece(first_output->path());
  if (opath != *primary_out) {
    EXPLAIN("expected depfile '%s' to mention '%s', got '%s'", path.c_str(),
            first_output->path().c_str(), primary_out->AsString().c_str());
    return false;
  }

  // Ensure that all mentioned outputs are outputs of the edge.
  for (std::vector<StringPiece>::iterator o = depfile.outs_.begin();
       o != depfile.outs_.end(); ++o) {
    matches m(o);
    if (std::find_if(edge->outputs_.begin(), edge->outputs_.end(), m) == edge->outputs_.end()) {
      *err = path + ": depfile mentions '" + o->AsString() + "' as an output, but no such output was declared";
      return false;
    }
  }

  // Preallocate space in edge->inputs_ to be filled in below.
  vector<Node*>::iterator implicit_dep =
      PreallocateSpace(edge, depfile.ins_.size());

  // Add all its in-edges.
  for (vector<StringPiece>::iterator i = depfile.ins_.begin();
       i != depfile.ins_.end(); ++i, ++implicit_dep) {
    uint64_t slash_bits;
    if (!CanonicalizePath(const_cast<char*>(i->str_), &i->len_, &slash_bits,
                          err))
      return false;

    Node* node = state_->GetNode(*i, slash_bits);
    *implicit_dep = node;
    node->AddOutEdge(edge);
    CreatePhonyInEdge(node);
  }

  return true;
}